

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::display_active_regs(RegAllocator *this)

{
  ostream *poVar1;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *plVar2;
  Tag *in_RSI;
  Function *function;
  _List_node_base *p_Var3;
  __node_base *p_Var4;
  allocator<char> local_11b;
  allocator<char> local_11a;
  ostream local_119;
  RegAllocator *local_118;
  string local_110;
  undefined1 local_f0 [80];
  undefined **local_a0;
  undefined8 local_98;
  undefined1 local_90;
  Function local_88;
  
  local_119 = (ostream)0x0;
  AixLog::operator<<(&local_119,(Severity *)in_RSI);
  AixLog::Tag::Tag((Tag *)(local_f0 + 0x20));
  AixLog::operator<<((ostream *)(local_f0 + 0x20),in_RSI);
  local_98 = std::chrono::_V2::system_clock::now();
  local_a0 = &PTR__Timestamp_001d8f28;
  local_90 = 0;
  AixLog::operator<<((ostream *)&local_a0,(Timestamp *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"display_active_regs",&local_11a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_11b);
  function = (Function *)local_f0;
  AixLog::Function::Function(&local_88,(string *)function,&local_110,200);
  AixLog::operator<<((ostream *)&local_88,function);
  AixLog::Function::~Function(&local_88);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)local_f0);
  AixLog::Tag::~Tag((Tag *)(local_f0 + 0x20));
  std::operator<<((ostream *)&std::clog,"active: ");
  p_Var4 = &(this->active)._M_h._M_before_begin;
  local_118 = this;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    poVar1 = std::operator<<(poVar1,"->[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"]");
    std::operator<<(poVar1,"; ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  std::operator<<((ostream *)&std::clog,"map: ");
  plVar2 = &local_118->active_reg_map;
  p_Var3 = (_List_node_base *)plVar2;
  while (p_Var3 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar2) {
    arm::display_reg_name((ostream *)&std::clog,*(Reg *)&p_Var3[1]._M_next);
    poVar1 = std::operator<<((ostream *)&std::clog,"->");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"; ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  return;
}

Assistant:

void display_active_regs() {
    auto &trace = LOG(TRACE);
    trace << "active: ";
    for (auto x : active) {
      trace << x.first << "->[" << x.second.start << "," << x.second.end << "]"
            << "; ";
    }
    trace << std::endl;
    trace << "map: ";
    for (auto x : active_reg_map) {
      display_reg_name(trace, x.first);
      trace << "->" << x.second << "; ";
    }
    trace << std::endl;
  }